

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

int Fraig_ManCheckMiter(Fraig_Man_t *p)

{
  Fraig_Node_t *pNode_00;
  int *piVar1;
  int local_24;
  int i;
  Fraig_Node_t *pNode;
  Fraig_Man_t *p_local;
  
  if (p->pModel != (int *)0x0) {
    free(p->pModel);
    p->pModel = (int *)0x0;
  }
  local_24 = 0;
  while( true ) {
    if (p->vOutputs->nSize <= local_24) {
      return 1;
    }
    pNode_00 = p->vOutputs->pArray[local_24];
    if (pNode_00 != (Fraig_Node_t *)((ulong)p->pConst1 ^ 1)) break;
    local_24 = local_24 + 1;
  }
  if (pNode_00 == p->pConst1) {
    piVar1 = Fraig_ManAllocCounterExample(p);
    p->pModel = piVar1;
    return 0;
  }
  piVar1 = Fraig_ManSaveCounterExample(p,pNode_00);
  p->pModel = piVar1;
  if (p->pModel == (int *)0x0) {
    return -1;
  }
  return 0;
}

Assistant:

int Fraig_ManCheckMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    ABC_FREE( p->pModel );
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        // get the output node (it can be complemented!)
        pNode = p->vOutputs->pArray[i];
        // if the miter is constant 0, the problem is UNSAT
        if ( pNode == Fraig_Not(p->pConst1) )
            continue;
        // consider the special case when the miter is constant 1
        if ( pNode == p->pConst1 )
        {
            // in this case, any counter example will do to distinquish it from constant 0
            // here we pick the counter example composed of all zeros
            p->pModel = Fraig_ManAllocCounterExample( p );
            return 0;
        }
        // save the counter example
        p->pModel = Fraig_ManSaveCounterExample( p, pNode );
        // if the model is not found, return undecided
        if ( p->pModel == NULL )
            return -1;
        else
            return 0;
    }
    return 1;
}